

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O2

bool __thiscall xercesc_4_0::XMLReader::setEncoding(XMLReader *this,XMLCh *newEncoding)

{
  bool bVar1;
  Encodings EVar2;
  XMLCh *pXVar3;
  XMLTranscoder *pXVar4;
  TranscodingException *this_00;
  Codes failReason_1;
  Codes failReason;
  
  if (this->fForcedEncoding != false) {
    return true;
  }
  pXVar3 = XMLString::replicate(newEncoding,this->fMemoryManager);
  XMLString::upperCaseASCII(pXVar3);
  bVar1 = XMLString::equals(pXVar3,(XMLCh *)XMLUni::fgUTF16EncodingString);
  if (((((bVar1) ||
        (bVar1 = XMLString::equals(pXVar3,(XMLCh *)XMLUni::fgUTF16EncodingString2), bVar1)) ||
       (bVar1 = XMLString::equals(pXVar3,(XMLCh *)XMLUni::fgUTF16EncodingString3), bVar1)) ||
      ((bVar1 = XMLString::equals(pXVar3,(XMLCh *)XMLUni::fgUTF16EncodingString4), bVar1 ||
       (bVar1 = XMLString::equals(pXVar3,(XMLCh *)XMLUni::fgUTF16EncodingString5), bVar1)))) ||
     ((bVar1 = XMLString::equals(pXVar3,(XMLCh *)XMLUni::fgUTF16EncodingString6), bVar1 ||
      (bVar1 = XMLString::equals(pXVar3,(XMLCh *)XMLUni::fgUTF16EncodingString7), bVar1)))) {
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,pXVar3);
    EVar2 = this->fEncoding;
    if (1 < EVar2 - UTF_16B) {
      return false;
    }
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fEncodingStr);
    this->fEncodingStr = (XMLCh *)0x0;
    if (EVar2 == UTF_16L) {
      pXVar3 = XMLString::replicate((XMLCh *)XMLUni::fgUTF16LEncodingString,this->fMemoryManager);
      this->fEncodingStr = pXVar3;
      EVar2 = UTF_16L;
    }
    else {
      pXVar3 = XMLString::replicate((XMLCh *)XMLUni::fgUTF16BEncodingString,this->fMemoryManager);
      this->fEncodingStr = pXVar3;
      EVar2 = UTF_16B;
    }
  }
  else {
    bVar1 = XMLString::equals(pXVar3,(XMLCh *)XMLUni::fgUCS4EncodingString);
    if (((bVar1) ||
        (bVar1 = XMLString::equals(pXVar3,(XMLCh *)XMLUni::fgUCS4EncodingString2), bVar1)) ||
       ((bVar1 = XMLString::equals(pXVar3,(XMLCh *)XMLUni::fgUCS4EncodingString3), bVar1 ||
        ((bVar1 = XMLString::equals(pXVar3,(XMLCh *)XMLUni::fgUCS4EncodingString4), bVar1 ||
         (bVar1 = XMLString::equals(pXVar3,(XMLCh *)XMLUni::fgUCS4EncodingString5), bVar1)))))) {
      (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,pXVar3);
      EVar2 = this->fEncoding;
      if (1 < EVar2 - UCS_4B) {
        return false;
      }
      (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fEncodingStr);
      this->fEncodingStr = (XMLCh *)0x0;
      if (EVar2 == UCS_4L) {
        pXVar3 = XMLString::replicate((XMLCh *)XMLUni::fgUCS4LEncodingString,this->fMemoryManager);
        this->fEncodingStr = pXVar3;
        EVar2 = UCS_4L;
      }
      else {
        pXVar3 = XMLString::replicate((XMLCh *)XMLUni::fgUCS4BEncodingString,this->fMemoryManager);
        this->fEncodingStr = pXVar3;
        EVar2 = UCS_4B;
      }
    }
    else {
      EVar2 = XMLRecognizer::encodingForName(pXVar3);
      (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fEncodingStr);
      this->fEncodingStr = pXVar3;
      if (EVar2 == OtherEncoding) {
        if (this->fTranscoder != (XMLTranscoder *)0x0) {
          (*this->fTranscoder->_vptr_XMLTranscoder[1])();
          this->fTranscoder = (XMLTranscoder *)0x0;
          pXVar3 = this->fEncodingStr;
        }
        pXVar4 = XMLTransService::makeNewTranscoderFor
                           (XMLPlatformUtils::fgTransService,pXVar3,&failReason,0x4000,
                            this->fMemoryManager);
        this->fTranscoder = pXVar4;
        if (pXVar4 == (XMLTranscoder *)0x0) {
          this_00 = (TranscodingException *)__cxa_allocate_exception(0x30);
          TranscodingException::TranscodingException
                    (this_00,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/XMLReader.cpp"
                     ,0x598,Trans_CantCreateCvtrFor,this->fEncodingStr,(XMLCh *)0x0,(XMLCh *)0x0,
                     (XMLCh *)0x0,this->fMemoryManager);
          goto LAB_002bff1d;
        }
        EVar2 = OtherEncoding;
      }
    }
  }
  if (this->fTranscoder == (XMLTranscoder *)0x0) {
    pXVar4 = XMLTransService::makeNewTranscoderFor
                       (XMLPlatformUtils::fgTransService,EVar2,&failReason_1,0x4000,
                        this->fMemoryManager);
    this->fTranscoder = pXVar4;
    if (pXVar4 == (XMLTranscoder *)0x0) {
      this_00 = (TranscodingException *)__cxa_allocate_exception(0x30);
      TranscodingException::TranscodingException
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/XMLReader.cpp"
                 ,0x5b2,Trans_CantCreateCvtrFor,this->fEncodingStr,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0,this->fMemoryManager);
LAB_002bff1d:
      __cxa_throw(this_00,&TranscodingException::typeinfo,XMLException::~XMLException);
    }
  }
  this->fEncoding = EVar2;
  return true;
}

Assistant:

bool XMLReader::setEncoding(const XMLCh* const newEncoding)
{
    //
    //  If the encoding was forced, then we ignore the new value and just
    //  return with success. If it was forced, then we are to use that
    //  encoding without question. Note that, if we are forced, we created
    //  a transcoder up front so there is no need to do one here in that
    //  case.
    //
    if (fForcedEncoding)
        return true;

    //
    // upperCase the newEncoding first for better performance
    //
    XMLCh* inputEncoding = XMLString::replicate(newEncoding, fMemoryManager);
    XMLString::upperCaseASCII(inputEncoding);

    XMLRecognizer::Encodings newBaseEncoding;
    //
    //  Check for non-endian specific UTF-16 or UCS-4. If so, and if we
    //  are already in one of the endian versions of those encodings,
    //  then just keep it and go on. Otherwise, its not valid.
    //
    if (XMLString::equals(inputEncoding, XMLUni::fgUTF16EncodingString)
    ||  XMLString::equals(inputEncoding, XMLUni::fgUTF16EncodingString2)
    ||  XMLString::equals(inputEncoding, XMLUni::fgUTF16EncodingString3)
    ||  XMLString::equals(inputEncoding, XMLUni::fgUTF16EncodingString4)
    ||  XMLString::equals(inputEncoding, XMLUni::fgUTF16EncodingString5)
    ||  XMLString::equals(inputEncoding, XMLUni::fgUTF16EncodingString6)
    ||  XMLString::equals(inputEncoding, XMLUni::fgUTF16EncodingString7))
    {
        fMemoryManager->deallocate(inputEncoding);

        if ((fEncoding != XMLRecognizer::UTF_16L)
        &&  (fEncoding != XMLRecognizer::UTF_16B))
        {
            return false;
        }

        // Override with the original endian specific encoding
        newBaseEncoding = fEncoding;

        if (fEncoding == XMLRecognizer::UTF_16L) {
            fMemoryManager->deallocate(fEncodingStr);
            fEncodingStr = 0;
            fEncodingStr = XMLString::replicate(XMLUni::fgUTF16LEncodingString, fMemoryManager);
        }
        else {
            fMemoryManager->deallocate(fEncodingStr);
            fEncodingStr = 0;
            fEncodingStr = XMLString::replicate(XMLUni::fgUTF16BEncodingString, fMemoryManager);
        }
    }
    else if (XMLString::equals(inputEncoding, XMLUni::fgUCS4EncodingString)
         ||  XMLString::equals(inputEncoding, XMLUni::fgUCS4EncodingString2)
         ||  XMLString::equals(inputEncoding, XMLUni::fgUCS4EncodingString3)
         ||  XMLString::equals(inputEncoding, XMLUni::fgUCS4EncodingString4)
         ||  XMLString::equals(inputEncoding, XMLUni::fgUCS4EncodingString5))
    {
        fMemoryManager->deallocate(inputEncoding);

        if ((fEncoding != XMLRecognizer::UCS_4L)
        &&  (fEncoding != XMLRecognizer::UCS_4B))
        {
            return false;
        }

        // Override with the original endian specific encoding
        newBaseEncoding = fEncoding;

        if (fEncoding == XMLRecognizer::UCS_4L) {

            fMemoryManager->deallocate(fEncodingStr);
            fEncodingStr = 0;
            fEncodingStr = XMLString::replicate(XMLUni::fgUCS4LEncodingString, fMemoryManager);
        }
        else {

            fMemoryManager->deallocate(fEncodingStr);
            fEncodingStr = 0;
            fEncodingStr = XMLString::replicate(XMLUni::fgUCS4BEncodingString, fMemoryManager);
        }
    }
     else
    {
        //
        //  Try to map the string to one of our standard encodings. If its not
        //  one of them, then it has to be one of the non-intrinsic encodings,
        //  in which case we have to delete our intrinsic encoder and create a
        //  new one.
        //
        newBaseEncoding = XMLRecognizer::encodingForName(inputEncoding);

        //
        //  If it does not come back as one of the auto-sensed encodings, then we
        //  have to possibly replace it and at least check a few things.
        //
        if (newBaseEncoding == XMLRecognizer::OtherEncoding)
        {
            //
            // We already know it's none of those non-endian special cases,
            // so just replicate the new name and use it directly to create the transcoder
            //
            fMemoryManager->deallocate(fEncodingStr);
            fEncodingStr = inputEncoding;

            // Check for a pre-created transcoder to delete.
            if (fTranscoder) {
                delete fTranscoder;
                fTranscoder = 0;
            }

            XMLTransService::Codes failReason;
            fTranscoder = XMLPlatformUtils::fgTransService->makeNewTranscoderFor
            (
                fEncodingStr
                , failReason
                , kCharBufSize
                , fMemoryManager
            );

            if (!fTranscoder)
                ThrowXMLwithMemMgr1(TranscodingException, XMLExcepts::Trans_CantCreateCvtrFor, fEncodingStr, fMemoryManager);
        }
        else
        {
            // Store the new encoding string since it is just an intrinsic
            fMemoryManager->deallocate(fEncodingStr);
            fEncodingStr = inputEncoding;
        }
    }

    if (!fTranscoder) {
        //
        //  Now we can create a transcoder using the recognized fEncoding.  We
        //  might get back a transcoder for an intrinsically supported encoding,
        //  or we might get one from the underlying transcoding service.
        //
        XMLTransService::Codes failReason;
        fTranscoder = XMLPlatformUtils::fgTransService->makeNewTranscoderFor
        (
            newBaseEncoding
            , failReason
            , kCharBufSize
            , fMemoryManager
        );

        if (!fTranscoder)
            ThrowXMLwithMemMgr1(TranscodingException, XMLExcepts::Trans_CantCreateCvtrFor, fEncodingStr, fMemoryManager);
    }

    // Update the base encoding member with the new base encoding found
    fEncoding = newBaseEncoding;

    // Looks ok to us
    return true;
}